

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict param_type_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  int iVar2;
  parse_ctx *ppVar3;
  parse_ctx *ppVar4;
  token_t ptVar5;
  node_t_conflict n;
  node_t_conflict pnVar6;
  node_t_conflict pnVar7;
  node_t_conflict pnVar8;
  size_t mark;
  node_t_conflict op3;
  node_t_conflict op4;
  pos_t pVar9;
  pos_t pVar10;
  node_t_conflict in_stack_ffffffffffffffa8;
  
  ppVar3 = c2m_ctx->parse_ctx;
  n = new_node(c2m_ctx,N_LIST);
  if (*(short *)ppVar3->curr_token != 0x29) {
    do {
      pnVar6 = declaration_specs(c2m_ctx,no_err_p,(node_t_conflict)0x0);
      if (pnVar6 == &err_struct) {
        return &err_struct;
      }
      if ((*(short *)ppVar3->curr_token == 0x2c) || (*(short *)ppVar3->curr_token == 0x29)) {
        pnVar7 = new_node(c2m_ctx,N_IGNORE);
        pnVar8 = new_node(c2m_ctx,N_LIST);
        pnVar7 = new_node2(c2m_ctx,N_DECL,pnVar7,pnVar8);
        pnVar6 = new_node2(c2m_ctx,N_TYPE,pnVar6,pnVar7);
      }
      else {
        mark = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
        ppVar4 = c2m_ctx->parse_ctx;
        pnVar7 = abstract_declarator(c2m_ctx,1);
        if ((pnVar7 == &err_struct) ||
           ((sVar1 = *(short *)ppVar4->curr_token, sVar1 != 0x2c && (sVar1 != 0x29)))) {
          record_stop(c2m_ctx,mark,1);
          pnVar7 = declarator(c2m_ctx,no_err_p);
          if (pnVar7 == &err_struct) {
            return &err_struct;
          }
          pnVar8 = try_attr_spec(c2m_ctx,ppVar3->curr_token->pos,(node_t_conflict *)0x0);
          if (pnVar8 == &err_struct) {
            pnVar8 = new_node(c2m_ctx,N_IGNORE);
          }
          pVar10 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                (node_t_conflict)(ulong)err_struct.uid);
          pVar9.fname = pVar10._8_8_;
          op3 = new_node(c2m_ctx,N_IGNORE);
          op4 = new_node(c2m_ctx,N_IGNORE);
          pVar9._8_8_ = pnVar6;
          pnVar6 = new_pos_node5(c2m_ctx,(node_code_t)pVar10.fname,pVar9,pnVar7,pnVar8,op3,op4,
                                 in_stack_ffffffffffffffa8);
        }
        else {
          iVar2 = c2m_ctx->parse_ctx->record_level;
          if (iVar2 < 1) {
            __assert_fail("record_level > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xf5d,"void record_stop(c2m_ctx_t, size_t, int)");
          }
          c2m_ctx->parse_ctx->record_level = iVar2 + -1;
          pnVar6 = new_node2(c2m_ctx,N_TYPE,pnVar6,pnVar7);
        }
      }
      op_append(c2m_ctx,n,pnVar6);
      if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x2c) {
        return n;
      }
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    } while (*(short *)ppVar3->curr_token != 0x10f);
    ptVar5 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar5 == 0x10f) {
      pVar9 = ptVar5->pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      pnVar6 = new_node(c2m_ctx,N_DOTS);
      add_pos(c2m_ctx,pnVar6,pVar9);
      op_append(c2m_ctx,n,pnVar6);
    }
    else {
      n = &err_struct;
      if (ppVar3->record_level == 0) {
        syntax_error(c2m_ctx,"...");
      }
    }
  }
  return n;
}

Assistant:

D (param_type_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, attrs, op1, op2, r = err_node;
  int comma_p;
  pos_t pos;

  list = new_node (c2m_ctx, N_LIST);
  if (C (')')) return list;
  for (;;) { /* parameter-list, parameter-declaration */
    PA (declaration_specs, NULL);
    op1 = r;
    if (C (',') || C (')')) {
      r = new_node2 (c2m_ctx, N_TYPE, op1,
                     new_node2 (c2m_ctx, N_DECL, new_node (c2m_ctx, N_IGNORE),
                                new_node (c2m_ctx, N_LIST)));
    } else if ((op2 = TRY (param_type_abstract_declarator)) != err_node) {
      /* Try param_type_abstract_declarator first for possible func
         type case ("<res_type> (<typedef_name>)") which can conflict with declarator ("<res_type>
         (<new decl identifier>)")  */
      r = new_node2 (c2m_ctx, N_TYPE, op1, op2);
    } else {
      P (declarator);
      attrs = try_attr_spec (c2m_ctx, curr_token->pos, NULL);
      if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
      r = new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (op2), op1, r, attrs,
                         new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE));
    }
    op_append (c2m_ctx, list, r);
    comma_p = FALSE;
    if (!M (',')) break;
    comma_p = TRUE;
    if (C (T_DOTS)) break;
  }
  if (comma_p) {
    PTP (T_DOTS, pos);
    op_append (c2m_ctx, list, new_pos_node (c2m_ctx, N_DOTS, pos));
  }
  return list;
}